

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidCustomMultipleWeights(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  int *piVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  CustomLayerParams *pCVar15;
  WeightParams *pWVar16;
  void *pvVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  uint32_t size;
  uint uVar21;
  Arena *pAVar22;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001a64d6:
    pRVar20 = &(MStack_78.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001a64d6;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar17 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar17 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar17 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pAVar10->datatype_ = 0x10040;
  this = &pAVar10->shape_;
  uVar2 = (pAVar10->shape_).current_size_;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar2] = 10;
  uVar21 = uVar2 + 1;
  (pAVar10->shape_).current_size_ = uVar21;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar21] = 0xb;
  uVar21 = uVar2 + 2;
  (pAVar10->shape_).current_size_ = uVar21;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar21] = 0xc;
  this->current_size_ = uVar2 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001a664a:
    pRVar20 = &(MStack_78.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001a664a;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x10),"probs",puVar19);
  if (*(long *)((long)pvVar17 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar17 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar17 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  ((pFVar9->Type_).multiarraytype_)->datatype_ = 0x10040;
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001a6745:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar13);
  }
  else {
    iVar1 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001a6745;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  pRVar4 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001a677d:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001a677d;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar17,0,*(char **)((long)pvVar17 + 8),0x3cb973);
  pRVar4 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001a67cd:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001a67cd;
    (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar17,0,*(char **)((long)pvVar17 + 8),0x3b872d);
  if (pNVar13->_oneof_case_[0] != 500) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 500;
    uVar5 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pCVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CustomLayerParams>
                        (pAVar22);
    (pNVar13->layer_).custom_ = pCVar15;
  }
  pCVar6 = (pNVar13->layer_).convolution_;
  uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)&pCVar6->outputshape_,"CustomClassName",puVar19);
  this_00 = &pCVar6->kernelsize_;
  piVar7 = *(int **)&pCVar6->_kernelsize_cached_byte_size_;
  if (piVar7 == (int *)0x0) {
LAB_001a6889:
    pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (*(Arena **)&this_00->current_size_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pWVar16);
  }
  else {
    iVar1 = *(int *)&(pCVar6->kernelsize_).arena_or_elements_;
    if (*piVar7 <= iVar1) goto LAB_001a6889;
    *(int *)&(pCVar6->kernelsize_).arena_or_elements_ = iVar1 + 1;
    pvVar17 = *(void **)(piVar7 + (long)iVar1 * 2 + 2);
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x20),"somebitshere",puVar19);
  piVar7 = *(int **)&pCVar6->_kernelsize_cached_byte_size_;
  if (piVar7 != (int *)0x0) {
    iVar1 = *(int *)&(pCVar6->kernelsize_).arena_or_elements_;
    if (iVar1 < *piVar7) {
      *(int *)&(pCVar6->kernelsize_).arena_or_elements_ = iVar1 + 1;
      pvVar17 = *(void **)(piVar7 + (long)iVar1 * 2 + 2);
      goto LAB_001a68f7;
    }
  }
  pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                      (*(Arena **)&this_00->current_size_);
  pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      ((RepeatedPtrFieldBase *)this_00,pWVar16);
LAB_001a68f7:
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x20),"bitsbits",puVar19);
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x28),"morebits",puVar19);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar8 = CoreML::Result::good(&local_48);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xfc8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar8;
}

Assistant:

int testInvalidCustomMultipleWeights() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    auto *params = layer->mutable_custom();

    params->set_classname("CustomClassName");

    auto *weights = params->add_weights();
    weights->set_float16value("somebitshere");

    auto *weights2 = params->add_weights();
    weights2->set_float16value("bitsbits");
    weights2->set_rawvalue("morebits");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}